

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O3

_Bool have_always_expectation_for(char *function)

{
  int iVar1;
  undefined8 *puVar2;
  int position;
  
  iVar1 = cgreen_vector_size(global_expectation_queue);
  position = 0;
  if (0 < iVar1) {
    do {
      puVar2 = (undefined8 *)cgreen_vector_get(global_expectation_queue,position);
      iVar1 = strcmp((char *)*puVar2,function);
      if ((iVar1 == 0) && (*(int *)((long)puVar2 + 0x14) == 0xf314159)) {
        position = 1;
        goto LAB_0010aec4;
      }
      position = position + 1;
      iVar1 = cgreen_vector_size(global_expectation_queue);
    } while (position < iVar1);
    position = 0;
  }
LAB_0010aec4:
  return SUB41(position,0);
}

Assistant:

static bool have_always_expectation_for(const char* function) {
    for (int i = 0; i < cgreen_vector_size(global_expectation_queue); i++) {
        RecordedExpectation *expectation =
                (RecordedExpectation *)cgreen_vector_get(global_expectation_queue, i);
        if (strcmp(expectation->function, function) == 0) {
            if (is_always_call(expectation)) {
                return true;
            }
        }
    }

    return false;
}